

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void kj::_::
     freePromise<kj::_::AdapterPromiseNode<unsigned_long,kj::(anonymous_namespace)::AsyncTee::ReadSink>>
               (AdapterPromiseNode<unsigned_long,_kj::(anonymous_namespace)::AsyncTee::ReadSink>
                *ptr)

{
  AdapterPromiseNode<unsigned_long,_kj::(anonymous_namespace)::AsyncTee::ReadSink> *ptr_local;
  
  dtor<kj::_::AdapterPromiseNode<unsigned_long,kj::(anonymous_namespace)::AsyncTee::ReadSink>>(ptr);
  return;
}

Assistant:

static void freePromise(T* ptr) {
  // Free a PromiseNode originally allocated using `allocPromise<T>()`. The implementation of
  // PromiseNode::destroy() must call this for any type that is allocated using allocPromise().

  if constexpr (PromiseDisposer::canArenaAllocate<T>()) {
    // The object will have been allocated in an arena, so we only want to run the destructor.
    // The arena's memory will be freed separately.
    kj::dtor(*ptr);
  } else {
    // The object will have been allocated separately on the heap.
    return delete ptr;
  }
}